

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_environment_lookBreakTargetRecursively(sysbvm_context_t *context,sysbvm_tuple_t environment)

{
  _Bool _Var1;
  sysbvm_analysisAndEvaluationEnvironment_t *environmentObject;
  sysbvm_tuple_t environment_local;
  sysbvm_context_t *context_local;
  
  _Var1 = sysbvm_environment_isAnalysisAndEvaluationEnvironment(context,environment);
  if (_Var1) {
    if (*(long *)(environment + 0x68) == 0) {
      context_local =
           (sysbvm_context_t *)
           sysbvm_environment_lookReturnTargetRecursively
                     (context,*(sysbvm_tuple_t *)(environment + 0x30));
    }
    else {
      context_local = *(sysbvm_context_t **)(environment + 0x68);
    }
  }
  else {
    context_local = (sysbvm_context_t *)0x0;
  }
  return (sysbvm_tuple_t)context_local;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_environment_lookBreakTargetRecursively(sysbvm_context_t *context, sysbvm_tuple_t environment)
{
    if(!sysbvm_environment_isAnalysisAndEvaluationEnvironment(context, environment))
        return SYSBVM_NULL_TUPLE;

    sysbvm_analysisAndEvaluationEnvironment_t *environmentObject = (sysbvm_analysisAndEvaluationEnvironment_t*)environment;
    if(environmentObject->breakTarget)
        return environmentObject->breakTarget;

    return sysbvm_environment_lookReturnTargetRecursively(context, environmentObject->super.parent);
}